

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbuscpp2xml.cpp
# Opt level: O1

QString * addFunction(QString *__return_storage_ptr__,FunctionDef *mm,bool isSignal)

{
  long lVar1;
  char *pcVar2;
  int *piVar3;
  qsizetype qVar4;
  Data *pDVar5;
  byte bVar6;
  bool bVar7;
  char cVar8;
  int iVar9;
  uint uVar10;
  QMetaTypeInterface *pQVar11;
  long lVar12;
  long lVar13;
  storage_type *psVar14;
  QChar QVar15;
  uint uVar16;
  char *pcVar17;
  QArrayData *pQVar18;
  int iVar19;
  undefined7 in_register_00000011;
  char *pcVar20;
  char16_t *pcVar21;
  ulong uVar22;
  storage_type *psVar23;
  byte bVar24;
  long in_FS_OFFSET;
  bool bVar25;
  QByteArrayView QVar26;
  QByteArrayView QVar27;
  QByteArrayView QVar28;
  QAnyStringView QVar29;
  QByteArrayView QVar30;
  QByteArrayView QVar31;
  QAnyStringView QVar32;
  QByteArrayView QVar33;
  QByteArrayView QVar34;
  QAnyStringView QVar35;
  QByteArrayView QVar36;
  QByteArrayView QVar37;
  QAnyStringView QVar38;
  QByteArrayView QVar39;
  QAnyStringView QVar40;
  QLatin1String QVar41;
  QByteArrayView QVar42;
  QAnyStringView QVar43;
  QByteArrayView QVar44;
  QArrayData *local_178;
  int local_170;
  QChar local_168;
  QArrayData *local_160 [3];
  QLatin1String local_148;
  QLatin1String local_130;
  undefined8 local_120;
  QString local_118;
  type local_f8;
  char *local_e0;
  QString local_d8;
  QList<QMetaType> local_b8;
  QArrayDataPointer<ArgumentDef> local_98;
  QMetaType local_80;
  QString local_78;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar20 = "method";
  uVar16 = (uint)CONCAT71(in_register_00000011,isSignal);
  if (uVar16 != 0) {
    pcVar20 = "signal";
  }
  local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d.d._0_4_ = 0xaaaaaaaa;
  local_78.d.d._4_4_ = 0xaaaaaaaa;
  local_78.d.ptr._0_4_ = 0xaaaaaaaa;
  local_78.d.ptr._4_4_ = 0xaaaaaaaa;
  pcVar17 = (mm->name).d.ptr;
  if (pcVar17 == (char *)0x0) {
    pcVar17 = (char *)&QByteArray::_empty;
  }
  iVar9 = 0;
  QString::asprintf((char *)&local_78,"    <%s name=\"%s\">\n",pcVar20,pcVar17);
  QVar26.m_data = (mm->normalizedType).d.ptr;
  QVar26.m_size = (mm->normalizedType).d.size;
  pQVar11 = (QMetaTypeInterface *)QMetaType::fromName(QVar26);
  if ((pQVar11 != (QMetaTypeInterface *)0x0) &&
     (iVar9 = (pQVar11->typeId)._q_value.super___atomic_base<int>._M_i, iVar9 == 0)) {
    iVar9 = QMetaType::registerHelper(pQVar11);
  }
  if (iVar9 == 0) {
    if ((mm->normalizedType).d.size != 0) {
      addFunction();
      goto LAB_0013d96b;
    }
  }
  else if (iVar9 != 0x2b) {
    QMetaType::QMetaType(&local_80,iVar9);
    pcVar20 = (char *)QDBusMetaType::typeToSignature(local_80);
    if (pcVar20 == (char *)0x0) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = 0;
    }
    else {
      QVar27.m_data = (storage_type *)0x27;
      QVar27.m_size = (qsizetype)&local_98;
      QString::fromLatin1(QVar27);
      local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      psVar23 = (storage_type *)0xffffffffffffffff;
      do {
        pcVar17 = pcVar20 + 1 + (long)psVar23;
        psVar23 = psVar23 + 1;
      } while (*pcVar17 != '\0');
      QVar28.m_data = psVar23;
      QVar28.m_size = (qsizetype)&local_f8;
      QString::fromLatin1(QVar28);
      local_58.d.d = (Data *)CONCAT44(local_f8.d.d._4_4_,local_f8.d.d._0_4_);
      local_58.d.ptr = (char16_t *)CONCAT44(local_f8.d.ptr._4_4_,local_f8.d.ptr._0_4_);
      local_58.d.size = CONCAT44(local_f8.d.size._4_4_,(undefined4)local_f8.d.size);
      QString::toHtmlEscaped();
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
        }
      }
      QVar29.m_size = (size_t)&local_98;
      QVar29.field_0.m_data = &local_f8;
      QString::arg_impl(QVar29,(int)local_b8.d.ptr,(QChar)(char16_t)local_b8.d.size);
      QString::append(&local_78);
      piVar3 = (int *)CONCAT44(local_f8.d.d._4_4_,local_f8.d.d._0_4_);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          QArrayData::deallocate
                    ((QArrayData *)CONCAT44(local_f8.d.d._4_4_,local_f8.d.d._0_4_),2,0x10);
        }
      }
      if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_98.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_98.d)->super_QArrayData,2,0x10);
        }
      }
      lVar12 = QDBusMetaType::signatureToMetaType(pcVar20);
      if (lVar12 == 0) {
        QVar30.m_data = (storage_type *)0x4b;
        QVar30.m_size = (qsizetype)&local_98;
        QString::fromLatin1(QVar30);
        pcVar17 = (mm->normalizedType).d.ptr;
        if (pcVar17 == (char *)0x0) {
          pcVar17 = (char *)&QByteArray::_empty;
        }
        local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        psVar23 = (storage_type *)0xffffffffffffffff;
        do {
          pcVar2 = pcVar17 + 1 + (long)psVar23;
          psVar23 = psVar23 + 1;
        } while (*pcVar2 != '\0');
        QVar31.m_data = psVar23;
        QVar31.m_size = (qsizetype)&local_f8;
        QString::fromLatin1(QVar31);
        local_58.d.d = (Data *)CONCAT44(local_f8.d.d._4_4_,local_f8.d.d._0_4_);
        local_58.d.ptr = (char16_t *)CONCAT44(local_f8.d.ptr._4_4_,local_f8.d.ptr._0_4_);
        local_58.d.size = CONCAT44(local_f8.d.size._4_4_,(undefined4)local_f8.d.size);
        QString::toHtmlEscaped();
        if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
          }
        }
        QVar32.m_size = (size_t)&local_98;
        QVar32.field_0.m_data = &local_f8;
        QString::arg_impl(QVar32,(int)local_b8.d.ptr,(QChar)(char16_t)local_b8.d.size);
        QString::append(&local_78);
        piVar3 = (int *)CONCAT44(local_f8.d.d._4_4_,local_f8.d.d._0_4_);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            QArrayData::deallocate
                      ((QArrayData *)CONCAT44(local_f8.d.d._4_4_,local_f8.d.d._0_4_),2,0x10);
          }
        }
        if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_98.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_98.d)->super_QArrayData,2,0x10);
          }
        }
      }
    }
    if (pcVar20 == (char *)0x0) goto LAB_0013d96b;
  }
  local_98.d = (mm->arguments).d.d;
  local_98.ptr = (mm->arguments).d.ptr;
  local_98.size = (mm->arguments).d.size;
  if (&(local_98.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((local_98.d)->super_QArrayData).ref_)->ref_)._q_value.super___atomic_base<int>
    ._M_i = (((QArrayData *)&((local_98.d)->super_QArrayData).ref_)->ref_)._q_value.
            super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_b8.d.d = (Data *)0x0;
  local_b8.d.ptr = (QMetaType *)0x0;
  local_b8.d.size = 0;
  local_d8.d.d = (Data *)0x0;
  local_d8.d.ptr = (char16_t *)0x0;
  local_d8.d.size = 0;
  iVar9 = qDBusParametersForMethod(mm,&local_b8,&local_d8);
  if (iVar9 == -1) {
    local_f8.d.d._0_4_ = 2;
    local_f8.d.d._4_4_ = 0;
    local_f8.d.ptr._0_4_ = 0;
    local_f8.d.ptr._4_4_ = 0;
    local_f8.d.size._0_4_ = 0;
    local_f8.d.size._4_4_ = 0;
    local_e0 = "default";
    QMessageLogger::warning();
    QString::toLocal8Bit_helper((QChar *)&local_118,(longlong)local_d8.d.ptr);
    qVar4 = local_130.m_size;
    pcVar21 = local_118.d.ptr;
    if (local_118.d.ptr == (char16_t *)0x0) {
      pcVar21 = (char16_t *)&QByteArray::_empty;
    }
    psVar23 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar20 = psVar23 + (long)pcVar21 + 1;
      psVar23 = psVar23 + 1;
    } while (*pcVar20 != '\0');
    QVar44.m_data = psVar23;
    QVar44.m_size = (qsizetype)&local_58;
    QString::fromUtf8(QVar44);
    QTextStream::operator<<((QTextStream *)qVar4,&local_58);
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((char)(((QArrayData *)(local_130.m_size + 0x30))->ref_)._q_value.super___atomic_base<int>.
              _M_i == '\x01') {
      QTextStream::operator<<((QTextStream *)local_130.m_size,' ');
    }
    if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_118.d.d)->super_QArrayData,1,0x10);
      }
    }
    QDebug::~QDebug((QDebug *)&local_130);
LAB_0013d900:
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    if (isSignal) {
      if (local_b8.d.size != iVar9 + 1) goto LAB_0013d900;
      if (isSignal) {
        local_f8.d.d._0_4_ = 0x156010;
        local_f8.d.d._4_4_ = 0;
        bVar7 = comparesEqual(local_b8.d.ptr + iVar9,(QMetaType *)&local_f8);
        if (bVar7) goto LAB_0013d900;
      }
    }
    bVar24 = mm->isScriptable;
    if (1 < (ulong)local_b8.d.size) {
      lVar12 = (long)iVar9;
      uVar22 = 1;
      do {
        local_f8.d.d._0_4_ = 0x156010;
        local_f8.d.d._4_4_ = 0;
        bVar7 = comparesEqual(local_b8.d.ptr + uVar22,(QMetaType *)&local_f8);
        bVar6 = 1;
        if (!bVar7) {
          local_118.d.d = (Data *)0x0;
          local_118.d.ptr = (char16_t *)0x0;
          local_118.d.size = 0;
          lVar1 = uVar22 - 1;
          if (local_98.ptr[uVar22 - 1].name.d.size != 0) {
            QVar33.m_data = (storage_type *)0xa;
            QVar33.m_size = (qsizetype)&local_58;
            QString::fromLatin1(QVar33);
            QVar34.m_data = (storage_type *)local_98.ptr[lVar1].name.d.size;
            QVar34.m_size = (qsizetype)&local_130;
            QString::fromLatin1(QVar34);
            QVar35.m_size = (size_t)&local_58;
            QVar35.field_0.m_data = &local_f8;
            QString::arg_impl(QVar35,(int)local_130.m_data,(QChar)(char16_t)local_120);
            pDVar5 = local_118.d.d;
            pQVar18 = (QArrayData *)CONCAT44(local_f8.d.d._4_4_,local_f8.d.d._0_4_);
            pcVar21 = (char16_t *)CONCAT44(local_f8.d.ptr._4_4_,local_f8.d.ptr._0_4_);
            local_f8.d.d._0_4_ = SUB84(local_118.d.d,0);
            local_f8.d.d._4_4_ = (undefined4)((ulong)local_118.d.d >> 0x20);
            qVar4 = CONCAT44(local_f8.d.size._4_4_,(undefined4)local_f8.d.size);
            local_f8.d.ptr._0_4_ = SUB84(local_118.d.ptr,0);
            local_f8.d.ptr._4_4_ = (undefined4)((ulong)local_118.d.ptr >> 0x20);
            local_f8.d.size._0_4_ = (undefined4)local_118.d.size;
            local_f8.d.size._4_4_ = (undefined4)((ulong)local_118.d.size >> 0x20);
            local_118.d.ptr = pcVar21;
            local_118.d.size = qVar4;
            if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                local_118.d.d = (Data *)pQVar18;
                QArrayData::deallocate(&pDVar5->super_QArrayData,2,0x10);
                pQVar18 = &(local_118.d.d)->super_QArrayData;
              }
            }
            local_118.d.d = (Data *)pQVar18;
            if ((QArrayData *)local_130.m_size != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_130.m_size)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_130.m_size)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_130.m_size)->_q_value).super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate((QArrayData *)local_130.m_size,2,0x10);
              }
            }
            if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
              }
            }
          }
          bVar25 = uVar22 - lVar12 == 0;
          bVar7 = (long)uVar22 < lVar12;
          pcVar20 = (char *)QDBusMetaType::typeToSignature(local_b8.d.ptr[uVar22].d_ptr);
          QVar36.m_data = (storage_type *)0x28;
          QVar36.m_size = (qsizetype)&local_58;
          QString::fromLatin1(QVar36);
          if (pcVar20 == (char *)0x0) {
            local_130.m_size = 0;
          }
          else {
            pQVar18 = (QArrayData *)0xffffffffffffffff;
            do {
              local_130.m_size = (long)&(pQVar18->ref_)._q_value.super___atomic_base<int>._M_i + 1;
              pcVar17 = pcVar20 + 1 + (long)pQVar18;
              pQVar18 = (QArrayData *)local_130.m_size;
            } while (*pcVar17 != '\0');
          }
          if ((bVar25 || bVar7) && !isSignal) {
            local_148.m_size = 2;
            local_148.m_data = "in";
          }
          else {
            local_148.m_size = 3;
            local_148.m_data = "out";
          }
          local_130.m_data = pcVar20;
          QString::arg<QString&,QLatin1String,QLatin1String>
                    (&local_f8,&local_58,&local_118,&local_130,&local_148);
          QString::append(&local_78);
          piVar3 = (int *)CONCAT44(local_f8.d.d._4_4_,local_f8.d.d._0_4_);
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              QArrayData::deallocate
                        ((QArrayData *)CONCAT44(local_f8.d.d._4_4_,local_f8.d.d._0_4_),2,0x10);
            }
          }
          if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
            }
          }
          lVar13 = QDBusMetaType::signatureToMetaType(pcVar20);
          if (lVar13 == 0) {
            if (local_b8.d.ptr[uVar22].d_ptr == (QMetaTypeInterface *)0x0) {
              pcVar20 = (char *)0x0;
            }
            else {
              pcVar20 = (local_b8.d.ptr[uVar22].d_ptr)->name;
            }
            lVar13 = uVar22 - lVar12;
            if (isSignal) {
              lVar13 = lVar1;
            }
            iVar9 = (int)lVar13;
            if ((long)uVar22 <= lVar12) {
              iVar9 = (int)lVar1;
            }
            QVar37.m_data = (storage_type *)0x4b;
            QVar37.m_size = (qsizetype)local_160;
            QString::fromLatin1(QVar37);
            iVar19 = 0x14a93c;
            if (!bVar25 && !bVar7 || isSignal) {
              iVar19 = 0x14a938;
            }
            QVar15.ucs = L'\x02';
            if (!bVar25 && !bVar7 || isSignal) {
              QVar15.ucs = L'\x03';
            }
            QVar38.m_size = (size_t)local_160;
            QVar38.field_0.m_data = &local_148;
            QString::arg_impl(QVar38,iVar19,QVar15);
            QString::arg_impl((longlong)&local_130,(int)&local_148,iVar9,(QChar)0x0);
            local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
            if (pcVar20 == (char *)0x0) {
              psVar23 = (storage_type *)0x0;
            }
            else {
              psVar14 = (storage_type *)0xffffffffffffffff;
              do {
                psVar23 = psVar14 + 1;
                pcVar17 = pcVar20 + 1 + (long)psVar14;
                psVar14 = psVar23;
              } while (*pcVar17 != '\0');
            }
            QVar39.m_data = psVar23;
            QVar39.m_size = (qsizetype)&local_f8;
            QString::fromLatin1(QVar39);
            local_58.d.d = (Data *)CONCAT44(local_f8.d.d._4_4_,local_f8.d.d._0_4_);
            local_58.d.ptr = (char16_t *)CONCAT44(local_f8.d.ptr._4_4_,local_f8.d.ptr._0_4_);
            local_58.d.size = CONCAT44(local_f8.d.size._4_4_,(undefined4)local_f8.d.size);
            QString::toHtmlEscaped();
            if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
              }
            }
            QVar40.m_size = (size_t)&local_130;
            QVar40.field_0.m_data = &local_f8;
            QString::arg_impl(QVar40,local_170,local_168);
            QString::append(&local_78);
            piVar3 = (int *)CONCAT44(local_f8.d.d._4_4_,local_f8.d.d._0_4_);
            if (piVar3 != (int *)0x0) {
              LOCK();
              *piVar3 = *piVar3 + -1;
              UNLOCK();
              if (*piVar3 == 0) {
                QArrayData::deallocate
                          ((QArrayData *)CONCAT44(local_f8.d.d._4_4_,local_f8.d.d._0_4_),2,0x10);
              }
            }
            if (local_178 != (QArrayData *)0x0) {
              LOCK();
              (local_178->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_178->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_178->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_178,2,0x10);
              }
            }
            if ((QArrayData *)local_130.m_size != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_130.m_size)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_130.m_size)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_130.m_size)->_q_value).super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate((QArrayData *)local_130.m_size,2,0x10);
              }
            }
            if ((QArrayData *)local_148.m_size != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_148.m_size)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_148.m_size)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_148.m_size)->_q_value).super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate((QArrayData *)local_148.m_size,2,0x10);
              }
            }
            if (local_160[0] != (QArrayData *)0x0) {
              LOCK();
              (local_160[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_160[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_160[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_160[0],2,0x10);
              }
            }
          }
          bVar6 = bVar24;
          if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_118.d.d)->super_QArrayData,2,0x10);
            }
          }
        }
        bVar24 = bVar6;
        uVar22 = uVar22 + 1;
      } while (uVar22 < (ulong)local_b8.d.size);
    }
    uVar10 = (uVar16 & 0xff) * 0x100 + 0x100;
    if ((bVar24 & 1) != 0) {
      uVar10 = (uVar16 & 0xff) * 0x10 + 0x10;
    }
    if ((flags & uVar10) == 0) goto LAB_0013d900;
    pcVar20 = (mm->tag).d.ptr;
    if (pcVar20 == (char *)0x0) {
      pcVar20 = (char *)&QByteArray::_empty;
    }
    cVar8 = qDBusCheckAsyncTag(pcVar20);
    if (cVar8 != '\0') {
      QVar41.m_data = (char *)0x4c;
      QVar41.m_size = (qsizetype)&local_78;
      QString::append(QVar41);
    }
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    pDVar5 = (Data *)CONCAT44(local_78.d.d._4_4_,local_78.d.d._0_4_);
    (__return_storage_ptr__->d).d = pDVar5;
    (__return_storage_ptr__->d).ptr =
         (char16_t *)CONCAT44(local_78.d.ptr._4_4_,local_78.d.ptr._0_4_);
    (__return_storage_ptr__->d).size = local_78.d.size;
    if (pDVar5 != (Data *)0x0) {
      LOCK();
      (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QVar42.m_data = (storage_type *)0xa;
    QVar42.m_size = (qsizetype)&local_58;
    QString::fromLatin1(QVar42);
    iVar9 = 0x14a81f;
    if (isSignal) {
      iVar9 = 0x14a818;
    }
    QVar43.m_size = (size_t)&local_58;
    QVar43.field_0.m_data = &local_f8;
    QString::arg_impl(QVar43,iVar9,(QChar)0x6);
    QString::append(__return_storage_ptr__);
    piVar3 = (int *)CONCAT44(local_f8.d.d._4_4_,local_f8.d.d._0_4_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_f8.d.d._4_4_,local_f8.d.d._0_4_),2,0x10)
        ;
      }
    }
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,8,0x10);
    }
  }
  QArrayDataPointer<ArgumentDef>::~QArrayDataPointer(&local_98);
LAB_0013d96b:
  piVar3 = (int *)CONCAT44(local_78.d.d._4_4_,local_78.d.d._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(local_78.d.d._4_4_,local_78.d.d._0_4_),2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

static QString addFunction(const FunctionDef &mm, bool isSignal = false) {

    QString xml = QString::asprintf("    <%s name=\"%s\">\n",
                                    isSignal ? "signal" : "method", mm.name.constData());

    // check the return type first
    int typeId = QMetaType::fromName(mm.normalizedType).id();
    if (typeId != QMetaType::Void) {
        if (typeId) {
            const char *typeName = QDBusMetaType::typeToSignature(QMetaType(typeId));
            if (typeName) {
                xml += QString::fromLatin1("      <arg type=\"%1\" direction=\"out\"/>\n")
                        .arg(typeNameToXml(typeName));

                    // do we need to describe this argument?
                    if (!QDBusMetaType::signatureToMetaType(typeName).isValid())
                        xml += QString::fromLatin1("      <annotation name=\"org.qtproject.QtDBus.QtTypeName.Out0\" value=\"%1\"/>\n")
                            .arg(typeNameToXml(mm.normalizedType.constData()));
            } else {
                return QString();
            }
        } else if (!mm.normalizedType.isEmpty()) {
            qWarning() << "Unregistered return type:" << mm.normalizedType.constData();
            return QString();
        }
    }
    QList<ArgumentDef> names = mm.arguments;
    QList<QMetaType> types;
    QString errorMsg;
    int inputCount = qDBusParametersForMethod(mm, types, errorMsg);
    if (inputCount == -1) {
        qWarning() << qPrintable(errorMsg);
        return QString();           // invalid form
    }
    if (isSignal && inputCount + 1 != types.size())
        return QString();           // signal with output arguments?
    if (isSignal && types.at(inputCount) == QDBusMetaTypeId::message())
        return QString();           // signal with QDBusMessage argument?

    bool isScriptable = mm.isScriptable;
    for (qsizetype j = 1; j < types.size(); ++j) {
        // input parameter for a slot or output for a signal
        if (types.at(j) == QDBusMetaTypeId::message()) {
            isScriptable = true;
            continue;
        }

        QString name;
        if (!names.at(j - 1).name.isEmpty())
            name = QString::fromLatin1("name=\"%1\" ").arg(QString::fromLatin1(names.at(j - 1).name));

        bool isOutput = isSignal || j > inputCount;

        const char *signature = QDBusMetaType::typeToSignature(QMetaType(types.at(j)));
        xml += QString::fromLatin1("      <arg %1type=\"%2\" direction=\"%3\"/>\n")
                .arg(name,
                     QLatin1StringView(signature),
                     isOutput ? "out"_L1 : "in"_L1);

        // do we need to describe this argument?
        if (!QDBusMetaType::signatureToMetaType(signature).isValid()) {
            const char *typeName = QMetaType(types.at(j)).name();
            xml += QString::fromLatin1("      <annotation name=\"org.qtproject.QtDBus.QtTypeName.%1%2\" value=\"%3\"/>\n")
                    .arg(isOutput ? "Out"_L1 : "In"_L1)
                    .arg(isOutput && !isSignal ? j - inputCount : j - 1)
                    .arg(typeNameToXml(typeName));
        }
    }

    int wantedMask;
    if (isScriptable)
        wantedMask = isSignal ? QDBusConnection::ExportScriptableSignals
                              : QDBusConnection::ExportScriptableSlots;
    else
        wantedMask = isSignal ? QDBusConnection::ExportNonScriptableSignals
                              : QDBusConnection::ExportNonScriptableSlots;
    if ((flags & wantedMask) != wantedMask)
        return QString();

    if (qDBusCheckAsyncTag(mm.tag.constData()))
        // add the no-reply annotation
        xml += "      <annotation name=\"" ANNOTATION_NO_WAIT "\" value=\"true\"/>\n"_L1;

    QString retval = xml;
    retval += QString::fromLatin1("    </%1>\n").arg(isSignal ? "signal"_L1 : "method"_L1);

    return retval;
}